

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void lastlistfield(FuncState *fs,ConsControl *cc)

{
  ConsControl *cc_local;
  FuncState *fs_local;
  
  if (cc->tostore != 0) {
    if (((cc->v).k == VCALL) || ((cc->v).k == VVARARG)) {
      luaK_setreturns(fs,&cc->v,-1);
      luaK_setlist(fs,(cc->t->u).info,cc->na,-1);
      cc->na = cc->na + -1;
    }
    else {
      if ((cc->v).k != VVOID) {
        luaK_exp2nextreg(fs,&cc->v);
      }
      luaK_setlist(fs,(cc->t->u).info,cc->na,cc->tostore);
    }
  }
  return;
}

Assistant:

static void lastlistfield (FuncState *fs, ConsControl *cc) {
  if (cc->tostore == 0) return;
  if (hasmultret(cc->v.k)) {
    luaK_setmultret(fs, &cc->v);
    luaK_setlist(fs, cc->t->u.info, cc->na, LUA_MULTRET);
    cc->na--;  /* do not count last expression (unknown number of elements) */
  }
  else {
    if (cc->v.k != VVOID)
      luaK_exp2nextreg(fs, &cc->v);
    luaK_setlist(fs, cc->t->u.info, cc->na, cc->tostore);
  }
  cc->na += cc->tostore;
}